

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void * operator_new(size_t size,align_val_t align)

{
  void *result;
  align_val_t align_local;
  size_t size_local;
  memalign_retry_data data;
  void *p;
  void *local_10;
  
  data._16_8_ = do_debug_memalign(align,size,-0x145237f);
  local_10 = (void *)data._16_8_;
  if ((void *)data._16_8_ == (void *)0x0) {
    data.size._0_4_ = 0xfebadc81;
    size_local = align;
    data.align = size;
    local_10 = anon_unknown.dwarf_5601::handle_oom(retry_debug_memalign,&size_local,true,false);
  }
  tcmalloc::InvokeNewHook(local_10,size);
  return local_10;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_new_aligned(size_t size, std::align_val_t align) {
  void* result = do_debug_memalign_or_debug_cpp_memalign(static_cast<size_t>(align), size, MallocBlock::kNewType, true, false);
  tcmalloc::InvokeNewHook(result, size);
  return result;
}